

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<long_double> * __thiscall
TPZVec<long_double>::operator=(TPZVec<long_double> *this,TPZVec<long_double> *rval)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (longdouble *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar5 = this->fNElements;
      plVar2 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
      this->fStore = plVar2;
      if (0 < (long)uVar5) {
        plVar1 = rval->fStore;
        lVar3 = 0;
        uVar4 = uVar5;
        do {
          *(unkbyte10 *)((long)plVar2 + lVar3) = *(unkbyte10 *)((long)plVar1 + lVar3);
          lVar3 = lVar3 + 0x10;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar5 = this->fNElements;
    }
    this->fNAlloc = uVar5;
    rval->fStore = (longdouble *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}